

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_vbuf.cxx
# Opt level: O0

void __thiscall
xray_re::xr_mesh_vbuf::extend<xray_re::_vector2<float>>
          (xr_mesh_vbuf *this,_vector2<float> **source,size_t new_size)

{
  _vector2<float> *source_00;
  undefined1 auVar1 [16];
  ulong uVar2;
  _vector2<float> *target_00;
  size_t size;
  _vector2<float> *target;
  size_t new_size_local;
  _vector2<float> **source_local;
  xr_mesh_vbuf *this_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = new_size;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  target_00 = (_vector2<float> *)operator_new__(uVar2);
  if (*source != (_vector2<float> *)0x0) {
    source_00 = *source;
    size = xr_flexbuf::size((xr_flexbuf *)this);
    xr_flexbuf::copy<xray_re::_vector2<float>>((xr_flexbuf *)this,source_00,target_00,size);
  }
  if (*source != (_vector2<float> *)0x0) {
    operator_delete(*source,8);
  }
  *source = target_00;
  return;
}

Assistant:

void xr_mesh_vbuf::extend(T*& source, size_t new_size)
{
	T* target = new T[new_size];
	if (source)
		copy(source, target, size());
	delete source;
	source = target;
}